

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdSignEcdsaAdaptor(void *handle,char *msg,char *sk,char *adaptor,char **adaptor_signature,
                       char **adaptor_proof)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  AdaptorPair pair;
  char *work_proof;
  char *work_signature;
  int result;
  AdaptorPair *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc90;
  ByteData local_308;
  string local_2f0;
  ByteData local_2d0;
  string local_2b8;
  allocator local_291;
  string local_290;
  Pubkey local_270;
  allocator local_251;
  string local_250;
  Privkey local_230;
  allocator local_209;
  string local_208;
  ByteData256 local_1e8;
  AdaptorPair local_1d0;
  undefined1 local_19a;
  allocator local_199;
  string local_198 [32];
  CfdSourceLocation local_178;
  undefined1 local_15a;
  allocator local_159;
  string local_158 [32];
  CfdSourceLocation local_138;
  undefined1 local_11a;
  allocator local_119;
  string local_118 [32];
  CfdSourceLocation local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  CfdSourceLocation local_b8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0xdc;
    local_78.funcname = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_78,"msg is null or empty.");
    local_9a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Failed to parameter. msg is null or empty.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
    local_9a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_b8.filename = local_b8.filename + 1;
    local_b8.line = 0xe2;
    local_b8.funcname = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_b8,"sk is null or empty.");
    local_da = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Failed to parameter. sk is null or empty.",&local_d9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
    local_da = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_f8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_f8.filename = local_f8.filename + 1;
    local_f8.line = 0xe8;
    local_f8.funcname = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_f8,"adaptor is null or empty.");
    local_11a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,"Failed to parameter. adaptor is null or empty.",&local_119);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
    local_11a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_138.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_138.filename = local_138.filename + 1;
    local_138.line = 0xee;
    local_138.funcname = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_138,"adaptor signature is null.");
    local_15a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,"Failed to parameter. adaptor signature is null.",&local_159);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
    local_15a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_38 == (undefined8 *)0x0) {
    local_178.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_178.filename = local_178.filename + 1;
    local_178.line = 0xf4;
    local_178.funcname = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>(&local_178,"adaptor proof is null.");
    local_19a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"Failed to parameter. adaptor proof is null.",&local_199)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
    local_19a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,local_18,&local_209);
  cfd::core::ByteData256::ByteData256(&local_1e8,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,local_20,&local_251);
  cfd::core::Privkey::Privkey(&local_230,&local_250,kMainnet,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,local_28,&local_291);
  cfd::core::Pubkey::Pubkey(&local_270,&local_290);
  cfd::core::AdaptorUtil::Sign(&local_1d0,&local_1e8,&local_230,&local_270);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5cb98d);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  cfd::core::Privkey::~Privkey((Privkey *)0x5cb9b4);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5cb9db);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  cfd::core::AdaptorSignature::GetData(&local_2d0,&local_1d0.signature);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2b8,&local_2d0);
  local_48 = cfd::capi::CreateString(in_stack_fffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_2b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x5cba5e);
  cfd::core::AdaptorProof::GetData(&local_308,&local_1d0.proof);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2f0,&local_308);
  local_50 = cfd::capi::CreateString(in_stack_fffffffffffffc90);
  std::__cxx11::string::~string((string *)&local_2f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x5cbac7);
  *local_30 = local_48;
  *local_38 = local_50;
  local_4 = 0;
  cfd::core::AdaptorPair::~AdaptorPair(in_stack_fffffffffffffc30);
  return local_4;
}

Assistant:

int CfdSignEcdsaAdaptor(
    void* handle, const char* msg, const char* sk, const char* adaptor,
    char** adaptor_signature, char** adaptor_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_signature = nullptr;
  char* work_proof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor signature is null.");
    }
    if (adaptor_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor proof is null.");
    }

    AdaptorPair pair =
        AdaptorUtil::Sign(ByteData256(msg), Privkey(sk), Pubkey(adaptor));

    work_signature = CreateString(pair.signature.GetData().GetHex());
    work_proof = CreateString(pair.proof.GetData().GetHex());

    *adaptor_signature = work_signature;
    *adaptor_proof = work_proof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_signature, &work_proof);
  return result;
}